

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectExpression.h
# Opt level: O0

void __thiscall ObjectExpression::ObjectExpression(ObjectExpression *this)

{
  ObjectExpression *this_local;
  
  Expression::Expression(&this->super_Expression);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR_evaluate_00195be8;
  std::
  unordered_map<Symbol,_std::shared_ptr<Expression>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Expression>_>_>_>
  ::unordered_map(&this->expressionMap);
  std::
  unordered_map<Symbol,_std::shared_ptr<Function>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Function>_>_>_>
  ::unordered_map(&this->functionMap);
  return;
}

Assistant:

explicit ObjectExpression() = default;